

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_pubsub_on_fork(void)

{
  channel_s *pcVar1;
  fio_ch_set__ordered_s_ *pfVar2;
  fio_ch_set__ordered_s_ *pfVar3;
  fio_ls_embd_s *pfVar4;
  
  fio_postoffice.filters.lock = '\0';
  fio_postoffice.pubsub.lock = '\0';
  fio_postoffice.patterns.lock = '\0';
  fio_postoffice.engines.lock = '\0';
  fio_postoffice.meta.lock = '\0';
  cluster_data.lock = '\0';
  cluster_data.uuid = 0;
  if ((fio_postoffice.filters.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (0 < (long)fio_postoffice.filters.channels.pos)) {
    pfVar3 = fio_postoffice.filters.channels.ordered + fio_postoffice.filters.channels.pos;
    pfVar2 = fio_postoffice.filters.channels.ordered;
    do {
      if (pfVar2->hash != 0) {
        pcVar1 = pfVar2->obj;
        pcVar1->lock = '\0';
        for (pfVar4 = (pcVar1->subscriptions).next; pfVar4 != &pcVar1->subscriptions;
            pfVar4 = pfVar4->next) {
          *(undefined1 *)&pfVar4[4].prev = 0;
        }
      }
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 < pfVar3);
  }
  if ((fio_postoffice.pubsub.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (0 < (long)fio_postoffice.pubsub.channels.pos)) {
    pfVar3 = fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos;
    pfVar2 = fio_postoffice.pubsub.channels.ordered;
    do {
      if (pfVar2->hash != 0) {
        pcVar1 = pfVar2->obj;
        pcVar1->lock = '\0';
        for (pfVar4 = (pcVar1->subscriptions).next; pfVar4 != &pcVar1->subscriptions;
            pfVar4 = pfVar4->next) {
          *(undefined1 *)&pfVar4[4].prev = 0;
        }
      }
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 < pfVar3);
  }
  if ((fio_postoffice.patterns.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (0 < (long)fio_postoffice.patterns.channels.pos)) {
    pfVar3 = fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
    pfVar2 = fio_postoffice.patterns.channels.ordered;
    do {
      if (pfVar2->hash != 0) {
        pcVar1 = pfVar2->obj;
        pcVar1->lock = '\0';
        for (pfVar4 = (pcVar1->subscriptions).next; pfVar4 != &pcVar1->subscriptions;
            pfVar4 = pfVar4->next) {
          *(undefined1 *)&pfVar4[4].prev = 0;
        }
      }
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 < pfVar3);
  }
  return;
}

Assistant:

static void fio_pubsub_on_fork(void) {
  fio_postoffice.filters.lock = FIO_LOCK_INIT;
  fio_postoffice.pubsub.lock = FIO_LOCK_INIT;
  fio_postoffice.patterns.lock = FIO_LOCK_INIT;
  fio_postoffice.engines.lock = FIO_LOCK_INIT;
  fio_postoffice.meta.lock = FIO_LOCK_INIT;
  cluster_data.lock = FIO_LOCK_INIT;
  cluster_data.uuid = 0;
  FIO_SET_FOR_LOOP(&fio_postoffice.filters.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
}